

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_suite.cpp
# Opt level: O0

void double_1_1_suite::test_input_half_output_quarter(void)

{
  double absolute_tolerance;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  reference pvVar1;
  double *in_stack_fffffffffffffe48;
  double *rhs;
  double local_170;
  double *local_168;
  value_type local_160;
  pointer local_158;
  double local_140;
  value_type local_138;
  value_type local_130;
  pointer local_128;
  double local_110;
  value_type local_108;
  value_type local_100 [3];
  value_type local_e8 [1];
  value_type local_e0 [1];
  undefined1 local_d8 [8];
  infinite<double> filter;
  vector<double,_std::allocator<double>_> history;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)
             &history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1e-05,absolute_tolerance);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  local_e0[0] = 0.5;
  local_e8[0] = 0.25;
  trial::online::impulse::infinite<double>::infinite<1ul,1ul>
            ((infinite<double> *)local_d8,&local_e0,&local_e8,1.0);
  trial::online::impulse::infinite<double>::push((infinite<double> *)local_d8,1.0);
  local_100[0] = trial::online::impulse::infinite<double>::value((infinite<double> *)local_d8);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)
             &filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,local_100);
  local_108 = trial::online::impulse::infinite<double>::value((infinite<double> *)local_d8);
  local_110 = 0.5;
  local_128 = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative =
       (double)history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1 * 0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x6b,0x10c2f1,(char *)&local_108,&local_110,in_stack_fffffffffffffe48,
             predicate_01);
  trial::online::impulse::infinite<double>::push((infinite<double> *)local_d8,2.0);
  local_130 = trial::online::impulse::infinite<double>::value((infinite<double> *)local_d8);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)
             &filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,&local_130);
  local_138 = trial::online::impulse::infinite<double>::value((infinite<double> *)local_d8);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &filter.output.coefficients.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0);
  local_140 = *pvVar1 * -0.25 + 1.0;
  local_158 = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative =
       (double)history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2 * 0.5 - history[0] * 0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x6e,0x10c2f1,(char *)&local_138,&local_140,in_stack_fffffffffffffe48,
             predicate_00);
  trial::online::impulse::infinite<double>::push((infinite<double> *)local_d8,3.0);
  local_160 = trial::online::impulse::infinite<double>::value((infinite<double> *)local_d8);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)
             &filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,&local_160);
  rhs = (double *)trial::online::impulse::infinite<double>::value((infinite<double> *)local_d8);
  local_168 = rhs;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &filter.output.coefficients.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,1);
  local_170 = *pvVar1 * -0.25 + 1.5;
  predicate.absolute = tolerance.relative;
  predicate.relative =
       (double)history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3 * 0.5 - history[1] * 0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x71,0x10c2f1,(char *)&local_168,&local_170,rhs,predicate);
  trial::online::impulse::infinite<double>::~infinite((infinite<double> *)local_d8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &filter.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void test_input_half_output_quarter()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    std::vector<double> history;
    impulse::infinite<double> filter({0.5}, {0.25});
    filter.push(1);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 1 * 0.5, tolerance);
    filter.push(2);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 2 * 0.5 - history[0] * 0.25, tolerance);
    filter.push(3);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 3 * 0.5 - history[1] * 0.25, tolerance);
}